

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

double rand_next_uint32(uint32_t *next)

{
  uint uVar1;
  
  uVar1 = *next * 0x41c64e6d + 0x3039;
  *next = uVar1;
  return (double)(uVar1 & 0x7fffffff) * 4.656612873077393e-10;
}

Assistant:

double rand_next_uint32( uint32_t * next )
{
    /* Same as the POSIX manual of rand() */
    uint32_t a = 1103515245;
    uint32_t c = 12345;
    uint32_t x = (*next) * a + c; 
    const uint32_t m = (1u<<31) - 1;
    *next = x;
    return (x & m )/ (1.0 + m);
}